

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O2

void __thiscall Vector2_Basics_Test::~Vector2_Basics_Test(Vector2_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Vector2, Basics) {
    Vector2f vf(-1, 10);
    EXPECT_EQ(vf, Vector2f(Vector2i(-1, 10)));
    EXPECT_NE(vf, Vector2f(-1, 100));
    EXPECT_EQ(Vector2f(-2, 20), vf + vf);
    EXPECT_EQ(Vector2f(0, 0), vf - vf);
    EXPECT_EQ(Vector2f(-2, 20), vf * 2);
    EXPECT_EQ(Vector2f(-2, 20), 2 * vf);
    EXPECT_EQ(Vector2f(-0.5, 5), vf / 2);
    EXPECT_EQ(Vector2f(1, 10), Abs(vf));
    EXPECT_EQ(vf, Ceil(Vector2f(-1.5, 9.9)));
    EXPECT_EQ(vf, Floor(Vector2f(-.5, 10.01)));
    EXPECT_EQ(Vector2f(-20, 10), Min(vf, Vector2f(-20, 20)));
    EXPECT_EQ(Vector2f(-1, 20), Max(vf, Vector2f(-20, 20)));
    EXPECT_EQ(-1, MinComponentValue(vf));
    EXPECT_EQ(-10, MinComponentValue(-vf));
    EXPECT_EQ(10, MaxComponentValue(vf));
    EXPECT_EQ(1, MaxComponentValue(-vf));
    EXPECT_EQ(1, MaxComponentIndex(vf));
    EXPECT_EQ(0, MaxComponentIndex(-vf));
    EXPECT_EQ(0, MinComponentIndex(vf));
    EXPECT_EQ(1, MinComponentIndex(-vf));
    EXPECT_EQ(vf, Permute(vf, {0, 1}));
    EXPECT_EQ(Vector2f(10, -1), Permute(vf, {1, 0}));
    EXPECT_EQ(Vector2f(10, 10), Permute(vf, {1, 1}));
}